

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O1

void __thiscall
TEST_TeamCityOutputTest_TestNameEscaped_End_Test::testBody
          (TEST_TeamCityOutputTest_TestNameEscaped_End_Test *this)

{
  TestResult *pTVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  
  UtestShell::setTestName((this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).tst,"\'[]\n\r");
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).result;
  (*pTVar1->_vptr_TestResult[6])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).tst);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).result;
  (*pTVar1->_vptr_TestResult[7])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).tst);
  pUVar2 = UtestShell::getCurrent();
  pcVar3 = SimpleString::asCharString
                     (&((this->super_TEST_GROUP_CppUTestGroupTeamCityOutputTest).mock)->output);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,
             "##teamcity[testStarted name=\'|\'|[|]|n|r\']\n##teamcity[testFinished name=\'|\'|[|]|n|r\' duration=\'0\']\n"
             ,pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
             ,200,pTVar4);
  return;
}

Assistant:

TEST(TeamCityOutputTest, TestNameEscaped_End)
{
	tst->setTestName("'[]\n\r");
	result->currentTestStarted(tst);
	result->currentTestEnded(tst);
	const char* expected =
		"##teamcity[testStarted name='|'|[|]|n|r']\n"
		"##teamcity[testFinished name='|'|[|]|n|r' duration='0']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}